

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmFScc<(moira::Instr)199,(moira::Mode)7,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  u32 uVar2;
  StrWriter *this_00;
  Ea<(moira::Mode)7,_1> result;
  u32 local_44;
  ushort local_40;
  u32 local_3c;
  
  uVar1 = *addr;
  uVar2 = dasmIncRead<2>(this,addr);
  if (((uVar2 & 0xffe0) != 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)199,(moira::Mode)7,1>(this,str,addr,op);
    return;
  }
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Fcc)(uVar2 & 0x3f));
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  local_44 = *addr;
  local_40 = op & 7;
  local_3c = dasmIncRead<2>(this,addr);
  StrWriter::operator<<(this_00,(Ea<(moira::Mode)7,_1> *)&local_44);
  return;
}

Assistant:

void
Moira::dasmFScc(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto cnd = __________xxxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << Fcc{cnd} << str.tab << Op<M, S>(reg, addr);
}